

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcppLibrary.hpp
# Opt level: O0

bool __thiscall tcpp::Lexer::AddCustomDirective(Lexer *this,string *directive)

{
  bool bVar1;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_30;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_28;
  string *local_20;
  string *directive_local;
  Lexer *this_local;
  
  local_20 = directive;
  directive_local = (string *)this;
  local_28._M_cur =
       (__node_type *)
       Catch::clara::std::
       unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::find(&this->mCustomDirectivesMap,directive);
  local_30._M_cur =
       (__node_type *)
       Catch::clara::std::
       unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::cend(&this->mCustomDirectivesMap);
  bVar1 = Catch::clara::std::__detail::operator!=(&local_28,&local_30);
  if (!bVar1) {
    Catch::clara::std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(&this->mCustomDirectivesMap,local_20);
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool Lexer::AddCustomDirective(const std::string& directive) TCPP_NOEXCEPT
	{
		if (mCustomDirectivesMap.find(directive) != mCustomDirectivesMap.cend())
		{
			return false;
		}

		mCustomDirectivesMap.insert(directive);
		return true;
	}